

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# md5.hpp
# Opt level: O0

IntermediateData rest_rpc::MD5::MD5CE::ProcessMessage(char *message,uint32_t n)

{
  uint32_t uVar1;
  uint32_t in_ESI;
  IntermediateData IVar2;
  uint32_t i;
  IntermediateData intermediate1;
  RoundData data;
  uint32_t offset;
  uint32_t m;
  IntermediateData intermediate0;
  uint32_t local_98;
  uint32_t uStackY_94;
  IntermediateData in_stack_ffffffffffffff78;
  undefined8 uVar3;
  uint uVar4;
  uint32_t uVar5;
  uint local_24;
  IntermediateData local_10;
  
  uVar1 = GetPaddedMessageLength(in_ESI);
  local_10.a = 0x67452301;
  local_10.b = 0xefcdab89;
  local_10.c = 0x98badcfe;
  local_10.d = 0x10325476;
  IVar2 = _local_98;
  for (local_24 = 0; _local_98 = IVar2, local_24 < uVar1; local_24 = local_24 + 0x40) {
    GetRoundData(in_stack_ffffffffffffff78._8_8_,in_stack_ffffffffffffff78.b,
                 in_stack_ffffffffffffff78.a,local_98._12_4_);
    uVar5 = local_10.a;
    uVar3 = local_10._8_8_;
    for (uVar4 = 0; uVar4 < 0x40; uVar4 = uVar4 + 1) {
      in_stack_ffffffffffffff78 =
           ApplyStep((uint32_t)uVar3,(RoundData *)CONCAT44(uVar5,uVar4),
                     in_stack_ffffffffffffff78._8_8_);
      uVar5 = in_stack_ffffffffffffff78.a;
      uVar3 = in_stack_ffffffffffffff78._8_8_;
    }
    IVar2 = Add(&local_10,(IntermediateData *)&stack0xffffffffffffff8c);
    _local_98 = IVar2._0_8_;
    local_10.a = local_98;
    local_10.b = uStackY_94;
    local_10._8_8_ = IVar2._8_8_;
  }
  IVar2.c = local_10.c;
  IVar2.d = local_10.d;
  IVar2.a = local_10.a;
  IVar2.b = local_10.b;
  return IVar2;
}

Assistant:

static IntermediateData ProcessMessage(const char *message,
                                         const uint32_t n) {
    const uint32_t m = GetPaddedMessageLength(n);
    IntermediateData intermediate0 = kInitialIntermediateData;
    for (uint32_t offset = 0; offset < m; offset += 64) {
      RoundData data = GetRoundData(message, n, m, offset);
      IntermediateData intermediate1 = intermediate0;
      for (uint32_t i = 0; i < 64; ++i)
        intermediate1 = ApplyStep(i, data, intermediate1);
      intermediate0 = Add(intermediate0, intermediate1);
    }
    return intermediate0;
  }